

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  stream *psVar5;
  size_t sVar6;
  ebml_crc *peVar7;
  filepos_t fVar8;
  long lVar9;
  ebml_crc *Element_00;
  bool_t bVar10;
  filepos_t fVar11;
  ebml_context *Context_00;
  stream *Input_00;
  stream *psVar12;
  bool bVar13;
  int UpperEltFound;
  uint8_t *CRCData;
  filepos_t OffSet;
  ebml_parser_context Context;
  int local_ac;
  ebml_crc *local_a8;
  char *local_a0;
  size_t local_98;
  stream *local_90;
  array local_88;
  filepos_t local_78;
  long local_70;
  int local_64;
  size_t local_60;
  long local_58;
  ebml_parser_context local_50;
  
  local_ac = 0;
  local_a0 = (char *)0x0;
  local_90 = Input;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if ((Element->Base).DataSize < 1) {
    bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
    Element_00 = (ebml_crc *)0x0;
    local_a8 = (ebml_crc *)0x0;
    local_98 = 0;
    Input_00 = local_90;
    if (bVar10 != 0) goto LAB_00113816;
  }
  Input_00 = local_90;
  if (local_90 == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x123,
                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                 );
  }
  pcVar2 = *(code **)((long)(local_90->Base).VMT + 0x78);
  fVar8 = EBML_ElementPositionData(&Element->Base);
  local_a8 = (ebml_crc *)0x0;
  lVar9 = (*pcVar2)(Input_00,fVar8,0);
  if (lVar9 == -1) {
    bVar4 = true;
    Element_00 = (ebml_crc *)0x0;
    local_98 = 0;
  }
  else {
    local_78 = (Element->Base).DataSize;
    local_50.Context = (Element->Base).Context;
    local_64 = Scope;
    local_50.UpContext = ParserContext;
    local_50.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    local_50.Profile = ParserContext->Profile;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input_00,&local_50,&local_ac,AllowDummyElt);
    if ((Element_00 != (ebml_crc *)0x0) && (local_ac < 1)) {
      local_98 = 0;
      local_58 = local_60 - 1;
      if (local_60 == 0) {
        local_58 = 0;
      }
      bVar3 = true;
      local_a8 = (ebml_crc *)0x0;
      do {
        bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
        if (bVar10 != 0) {
          fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar11 = EBML_ElementPositionEnd(&Element->Base);
          if (fVar11 < fVar8) goto LAB_00113809;
        }
        if ((AllowDummyElt == 0) && (bVar10 = EBML_ElementIsDummy(&Element_00->Base), bVar10 != 0))
        {
          EBML_ElementSkipData(&Element_00->Base,Input_00,&local_50,(ebml_element *)0x0,0);
LAB_0011359f:
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
        else {
          iVar1 = local_64;
          lVar9 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                            (Element_00,Input_00,&local_50,AllowDummyElt,local_64,local_58);
          if (lVar9 != 0) goto LAB_0011359f;
          if (((iVar1 != 2) && (local_60 != 0)) && (bVar3)) {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar10 = EBML_ElementIsType(&Element_00->Base,Context_00);
            bVar3 = true;
            if (local_a8 == (ebml_crc *)0x0 && bVar10 != 0) {
              bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
              psVar5 = local_90;
              psVar12 = Input_00;
              if (bVar10 == 0) {
LAB_001136bf:
                local_a8 = (ebml_crc *)0x0;
                Input_00 = psVar12;
                peVar7 = local_a8;
              }
              else {
                bVar10 = Node_IsPartOf(local_90,0x534d454d);
                peVar7 = Element_00;
                if (bVar10 == 0) {
                  local_88._Begin = (char *)0x0;
                  local_88._Used = 0;
                  fVar8 = EBML_ElementPositionEnd(&Element->Base);
                  fVar11 = EBML_ElementPositionEnd(&Element_00->Base);
                  if (fVar8 - fVar11 != 0xffffffffffffffff) {
                    bVar10 = ArrayResize(&local_88,fVar8 - fVar11,0);
                    sVar6 = local_88._Used;
                    bVar3 = false;
                    local_a8 = Element_00;
                    if (bVar10 == 0) goto LAB_001136ca;
                    local_a0 = local_88._Begin;
                    Input_00 = (stream *)NodeCreate(Element,0x534d454d);
                    local_98 = sVar6;
                    if (Input_00 == (stream *)0x0) {
                      ArrayClear(&local_88);
                      Input_00 = local_90;
                    }
                    else {
                      local_70 = EBML_ElementPositionEnd(&Element_00->Base);
                      (**(code **)((long)(Input_00->Base).VMT + 0x20))
                                (Input_00,0x100,local_a0,sVar6);
                      (**(code **)((long)(Input_00->Base).VMT + 0x20))(Input_00,0x102,&local_70);
                      psVar12 = local_90;
                      local_a8 = *(ebml_crc **)((long)(local_90->Base).VMT + 0x78);
                      fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
                      (*(code *)local_a8)(psVar12,fVar8,0);
                      lVar9 = (**(code **)((long)(psVar12->Base).VMT + 0x58))
                                        (psVar12,local_a0,sVar6);
                      if (lVar9 != 0) {
                        StreamClose(Input_00);
                        ArrayClear(&local_88);
                        local_a0 = (char *)0x0;
                        goto LAB_001136bf;
                      }
                    }
                  }
                }
                else {
                  pcVar2 = *(code **)((long)(psVar5->Base).VMT + 0x78);
                  fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
                  lVar9 = (*pcVar2)(psVar5,fVar8,0);
                  (**(code **)((long)(psVar5->Base).VMT + 0x18))(psVar5,0x102,&local_70,8);
                  (**(code **)((long)(psVar5->Base).VMT + 0x18))(psVar5,0x101,&local_a0);
                  local_a0 = local_a0 + (lVar9 - local_70);
                  fVar8 = EBML_ElementDataSize(&Element->Base,1);
                  fVar11 = EBML_ElementFullSize(&Element_00->Base,1);
                  local_98 = fVar8 - fVar11;
                  (**(code **)((long)(psVar5->Base).VMT + 0x58))(psVar5,local_a0,local_98);
                }
              }
              local_a8 = peVar7;
              bVar3 = false;
            }
          }
LAB_001136ca:
          if (local_a8 != Element_00) {
            EBML_MasterAppend(Element,&Element_00->Base);
          }
          EBML_ElementSkipData
                    (&Element_00->Base,Input_00,&local_50,(ebml_element *)0x0,AllowDummyElt);
        }
        if (Element_00 != (ebml_crc *)0x0) {
          fVar8 = EBML_ElementPositionEnd(&Element->Base);
          local_78 = EBML_ElementPositionEnd(&Element_00->Base);
          local_78 = fVar8 - local_78;
        }
        if (local_ac < 1) {
          if (((local_ac < 0) && (local_ac = local_ac + 1, local_ac != 0)) ||
             ((bVar10 = EBML_ElementIsFiniteSize(&Element->Base), bVar10 != 0 && (local_78 < 1)))) {
            bVar4 = false;
            goto LAB_0011380c;
          }
          Element_00 = (ebml_crc *)EBML_FindNextElement(Input_00,&local_50,&local_ac,AllowDummyElt);
        }
        else {
          iVar1 = local_ac + -1;
          bVar4 = false;
          bVar13 = local_ac != 1;
          local_ac = iVar1;
          if ((bVar13) ||
             ((bVar10 = EBML_ElementIsFiniteSize(&Element->Base), bVar10 != 0 && (local_78 < 1))))
          goto LAB_0011380c;
        }
        bVar4 = false;
        if ((Element_00 == (ebml_crc *)0x0) || (0 < local_ac)) goto LAB_0011380c;
      } while( true );
    }
    local_98 = 0;
LAB_00113809:
    bVar4 = false;
  }
LAB_0011380c:
  if (bVar4) {
    return -9;
  }
LAB_00113816:
  peVar7 = local_a8;
  if (local_a0 != (char *)0x0) {
    bVar10 = EBML_CRCMatches(local_a8,local_a0,local_98);
    Element->CheckSumStatus = 2 - (uint)(bVar10 == 0);
    NodeDelete((node *)peVar7);
    if (local_a0 == local_88._Begin) {
      StreamClose(Input_00);
      ArrayClear(&local_88);
    }
  }
  (Element->Base).bValueIsSet = '\x01';
  if (0 < local_ac) {
    if (Element_00 == (ebml_crc *)0x0) {
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    if (local_90 == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a1,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    (**(code **)((long)(local_90->Base).VMT + 0x78))(local_90,(Element_00->Base).ElementPosition,0);
    NodeDelete((node *)Element_00);
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_master *Element, struct stream *Input, const ebml_parser_context *ParserContext, bool_t AllowDummyElt, int Scope, size_t DepthCheckCRC)
{
    int UpperEltFound = 0;
    bool_t bFirst = 1;
    ebml_element *SubElement = NULL;
    ebml_crc *CRCElement = NULL;
    struct stream *ReadStream = Input;
    array CrcBuffer;
    uint8_t *CRCData = NULL;
    size_t CRCDataSize = 0;

    // remove all existing elements, including the mandatory ones...
    NodeTree_Clear((nodetree*)Element);
    Element->Base.bValueIsSet = 0;

	// read blocks and discard the ones we don't care about
	if (Element->Base.DataSize > 0 || !EBML_ElementIsFiniteSize((ebml_element*)Element)) {
        ebml_parser_context Context;
        filepos_t MaxSizeToRead;

        if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
            return ERR_END_OF_FILE;

        MaxSizeToRead = Element->Base.DataSize;
        Context.UpContext = ParserContext;
        Context.Context = Element->Base.Context;
        Context.EndPosition = EBML_ElementPositionEnd((ebml_element*)Element);
        Context.Profile = ParserContext->Profile;
        SubElement = EBML_FindNextElement(Input,&Context,&UpperEltFound,AllowDummyElt);
		while (SubElement && UpperEltFound<=0 && (!EBML_ElementIsFiniteSize((ebml_element*)Element) || EBML_ElementPositionEnd(SubElement) <= EBML_ElementPositionEnd((ebml_element*)Element)))
        {
			if (!AllowDummyElt && EBML_ElementIsDummy(SubElement)) {
                // TODO: this should never happen
                EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
				NodeDelete((node*)SubElement); // forget this unknown element
                SubElement = NULL;
			}
            else
            {
                if (EBML_ElementReadData(SubElement,ReadStream,&Context,AllowDummyElt, Scope, DepthCheckCRC?DepthCheckCRC-1:0)==ERR_NONE)
                {
                    if (bFirst && DepthCheckCRC && Scope!=SCOPE_NO_DATA && EBML_ElementIsType(SubElement, EBML_getContextEbmlCrc32()) && CRCElement==NULL)
                    {
                        if (EBML_ElementIsFiniteSize((ebml_element*)Element))
                        {
                            CRCElement = (ebml_crc*)SubElement;
                            if (Node_IsPartOf(Input, MEMSTREAM_CLASS))
                            {
                                filepos_t DataPos = Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                filepos_t OffSet;
                                Node_GET(Input,MEMSTREAM_OFFSET,&OffSet);
                                Node_GET(Input,MEMSTREAM_PTR,&CRCData);
                                CRCData += (DataPos - OffSet);
                                CRCDataSize = (size_t)(EBML_ElementDataSize((ebml_element*)Element,1) - EBML_ElementFullSize(SubElement,1));
                                Stream_Read(Input, CRCData, CRCDataSize, NULL);
                            }
                            else
                            {
                                // read the rest of the element in memory to avoid reading it a second time later
                                ArrayInit(&CrcBuffer);
                                filepos_t element_size = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement);
#if MAX_FILEPOS >= SIZE_MAX
                                if ((filepos_t)element_size < (filepos_t)SIZE_MAX
#else
                                if ((size_t)element_size < (size_t)SIZE_MAX
#endif
                                    && ArrayResize(&CrcBuffer, (size_t)element_size, 0))
                                {
                                    CRCData = ARRAYBEGIN(CrcBuffer,uint8_t);
                                    CRCDataSize = ARRAYCOUNT(CrcBuffer,uint8_t);
                                    ReadStream = (struct stream*)NodeCreate(Element, MEMSTREAM_CLASS);
                                    if (ReadStream==NULL)
                                    {
                                        ReadStream=Input; // revert back to normal reading
                                        ArrayClear(&CrcBuffer);
                                    }
                                    else
                                    {
                                        filepos_t Offset = EBML_ElementPositionEnd(SubElement);
                                        Node_Set(ReadStream, MEMSTREAM_DATA, CRCData, CRCDataSize);
                                        Node_SET(ReadStream, MEMSTREAM_OFFSET, &Offset);
                                        Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                        if (Stream_Read(Input, CRCData, CRCDataSize, NULL)!=ERR_NONE)
                                        {
                                            StreamClose(ReadStream);
                                            ReadStream=Input; // revert back to normal reading
                                            ArrayClear(&CrcBuffer);
                                            CRCData = NULL;
                                            CRCElement = NULL;
                                        }
                                    }
                                }
                            }
                        }
                        bFirst = 0;
                    }
                    if (CRCElement != (ebml_crc*)SubElement)
                        EBML_MasterAppend(Element,SubElement);
			        // just in case
                    EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
                }
                else
                {
                    NodeDelete((node*)SubElement);
                    SubElement = NULL;
                }
			}
            if (SubElement)
			    MaxSizeToRead = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement); // even if it's the default value

			if (UpperEltFound > 0) {
				UpperEltFound--;
				if (UpperEltFound > 0 || (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0))
					goto processCrc;
				continue;
			}

			if (UpperEltFound < 0) {
				UpperEltFound++;
				if (UpperEltFound < 0)
					goto processCrc;
			}

			if (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0) {
				goto processCrc;// this level is finished
			}

			SubElement = EBML_FindNextElement(ReadStream,&Context,&UpperEltFound,AllowDummyElt);
		}
	}
processCrc:
    if (CRCData!=NULL)
    {
        Element->CheckSumStatus = EBML_CRCMatches(CRCElement, CRCData, CRCDataSize)?2:1;
        NodeDelete((node*)CRCElement);
        if (CRCData == ARRAYBEGIN(CrcBuffer,uint8_t))
        {
            StreamClose(ReadStream);
            ArrayClear(&CrcBuffer);
        }
    }

    Element->Base.bValueIsSet = 1;
    if (UpperEltFound>0) // move back to the upper element beginning so that the next loop can find it
    {
        assert(SubElement!=NULL);
        Stream_Seek(Input,SubElement->ElementPosition,SEEK_SET);
        NodeDelete((node*)SubElement); // forget about it, it will be read again later
    }
    return ERR_NONE;
}